

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addNamePattern(TestSpecParser *this)

{
  ulong uVar1;
  shared_ptr<Catch::TestSpec::ExcludedPattern> local_70 [2];
  undefined1 local_50 [24];
  PatternPtr pattern;
  string token;
  TestSpecParser *this_local;
  
  preprocessPattern_abi_cxx11_
            ((string *)
             &pattern.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::make_shared<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pattern.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::NamePattern,void>
              ((shared_ptr<Catch::TestSpec::Pattern> *)(local_50 + 0x10),
               (shared_ptr<Catch::TestSpec::NamePattern> *)local_50);
    clara::std::shared_ptr<Catch::TestSpec::NamePattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::NamePattern> *)local_50);
    if ((this->m_exclusion & 1U) != 0) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)local_70);
      std::shared_ptr<Catch::TestSpec::Pattern>::operator=
                ((shared_ptr<Catch::TestSpec::Pattern> *)(local_50 + 0x10),local_70);
      clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr(local_70);
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)(local_50 + 0x10));
    clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::Pattern> *)(local_50 + 0x10));
  }
  std::__cxx11::string::clear();
  this->m_exclusion = false;
  this->m_mode = None;
  std::__cxx11::string::~string
            ((string *)
             &pattern.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void TestSpecParser::addNamePattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            TestSpec::PatternPtr pattern = std::make_shared<TestSpec::NamePattern>(token, m_substring);
            if (m_exclusion)
                pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
            m_currentFilter.m_patterns.push_back(pattern);
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }